

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O0

void __thiscall ConvertorPCM2WAV::write_chunk(ConvertorPCM2WAV *this,string *name,PBuffer *data)

{
  element_type *peVar1;
  element_type *this_00;
  size_t sVar2;
  PMutableBuffer *this_01;
  shared_ptr<Buffer> local_30;
  PBuffer *local_20;
  PBuffer *data_local;
  string *name_local;
  ConvertorPCM2WAV *this_local;
  
  this_01 = &this->result;
  local_20 = data;
  data_local = (PBuffer *)name;
  name_local = (string *)this;
  peVar1 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_01);
  MutableBuffer::push(peVar1,(string *)data_local);
  peVar1 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_01);
  this_00 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)data
                      );
  sVar2 = Buffer::get_size(this_00);
  MutableBuffer::push<unsigned_int>(peVar1,(uint)sVar2,1);
  peVar1 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_01);
  std::shared_ptr<Buffer>::shared_ptr(&local_30,data);
  MutableBuffer::push(peVar1,&local_30);
  std::shared_ptr<Buffer>::~shared_ptr(&local_30);
  return;
}

Assistant:

void
ConvertorPCM2WAV::write_chunk(const std::string &name, PBuffer data) {
  result->push(name);
  result->push<uint32_t>(static_cast<uint32_t>(data->get_size()));
  result->push(data);
}